

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O1

int evthread_use_pthreads(void)

{
  int iVar1;
  int iVar2;
  evthread_condition_callbacks cond_cbs;
  evthread_lock_callbacks cbs;
  evthread_condition_callbacks local_68;
  evthread_lock_callbacks local_38;
  
  local_38.unlock = evthread_posix_unlock;
  local_38.free = evthread_posix_lock_free;
  local_38.lock = evthread_posix_lock;
  local_38.lock_api_version = 1;
  local_38.supported_locktypes = 1;
  local_38.alloc = evthread_posix_lock_alloc;
  local_68.wait_condition = evthread_posix_cond_wait;
  local_68.free_condition = evthread_posix_cond_free;
  local_68.signal_condition = evthread_posix_cond_signal;
  local_68.condition_api_version = 1;
  local_68._4_4_ = 0;
  local_68.alloc_condition = evthread_posix_cond_alloc;
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr_recursive);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr_recursive,1);
    if (iVar1 == 0) {
      evthread_set_lock_callbacks(&local_38);
      evthread_set_condition_callbacks(&local_68);
      evthread_set_id_callback(evthread_posix_get_id);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
evthread_use_pthreads(void)
{
	struct evthread_lock_callbacks cbs = {
		EVTHREAD_LOCK_API_VERSION,
		EVTHREAD_LOCKTYPE_RECURSIVE,
		evthread_posix_lock_alloc,
		evthread_posix_lock_free,
		evthread_posix_lock,
		evthread_posix_unlock
	};
	struct evthread_condition_callbacks cond_cbs = {
		EVTHREAD_CONDITION_API_VERSION,
		evthread_posix_cond_alloc,
		evthread_posix_cond_free,
		evthread_posix_cond_signal,
		evthread_posix_cond_wait
	};
	/* Set ourselves up to get recursive locks. */
	if (pthread_mutexattr_init(&attr_recursive))
		return -1;
	if (pthread_mutexattr_settype(&attr_recursive, PTHREAD_MUTEX_RECURSIVE))
		return -1;

	evthread_set_lock_callbacks(&cbs);
	evthread_set_condition_callbacks(&cond_cbs);
	evthread_set_id_callback(evthread_posix_get_id);
	return 0;
}